

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O1

void __thiscall mjs::string::string(string *this,gc_heap *h,string_view *s)

{
  gc_heap *local_20;
  uint32_t local_18;
  
  gc_heap::
  allocate_and_construct<mjs::gc_string,std::basic_string_view<char,std::char_traits<char>>const&>
            ((gc_heap *)&stack0xffffffffffffffe0,(size_t)h,
             (basic_string_view<char,_std::char_traits<char>_> *)(s->_M_len * 4 + 4));
  (this->super_gc_heap_ptr<mjs::gc_string>).super_gc_heap_ptr_untyped.heap_ = local_20;
  (this->super_gc_heap_ptr<mjs::gc_string>).super_gc_heap_ptr_untyped.pos_ = local_18;
  if (local_20 != (gc_heap *)0x0) {
    gc_heap::attach(local_20,(gc_heap_ptr_untyped *)this);
  }
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&stack0xffffffffffffffe0);
  return;
}

Assistant:

explicit string(gc_heap& h, const std::string_view& s) : gc_heap_ptr<gc_string>(gc_string::make(h, s)) {}